

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QWizardField>::emplace<QWizardField_const&>
          (QMovableArrayOps<QWizardField> *this,qsizetype i,QWizardField *args)

{
  QWizardField **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_d0;
  QWizardField tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.size == i
       ) {
      qVar5 = QArrayDataPointer<QWizardField>::freeSpaceAtEnd
                        ((QArrayDataPointer<QWizardField> *)this);
      if (qVar5 == 0) goto LAB_004c8c3a;
      QWizardField::QWizardField
                ((this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.
                 ptr + (this->super_QGenericArrayOps<QWizardField>).
                       super_QArrayDataPointer<QWizardField>.size,args);
LAB_004c8d40:
      pqVar2 = &(this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.
                size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_004c8cf9;
    }
LAB_004c8c3a:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QWizardField>::freeSpaceAtBegin
                        ((QArrayDataPointer<QWizardField> *)this);
      if (qVar5 != 0) {
        QWizardField::QWizardField
                  ((this->super_QGenericArrayOps<QWizardField>).
                   super_QArrayDataPointer<QWizardField>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QWizardField>).
                   super_QArrayDataPointer<QWizardField>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_004c8d40;
      }
    }
  }
  tmp.initialValue.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.initialValue.d._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.initialValue.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.initialValue.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.changedSignal.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  tmp.changedSignal.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.property.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.changedSignal.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.property.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.property.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  tmp._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.object = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.name.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.page = (QWizardPage *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QWizardField::QWizardField(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.size !=
          0;
  QArrayDataPointer<QWizardField>::detachAndGrow
            ((QArrayDataPointer<QWizardField> *)this,(uint)(i == 0 && bVar6),1,(QWizardField **)0x0,
             (QArrayDataPointer<QWizardField> *)0x0);
  if (i == 0 && bVar6) {
    QWizardField::QWizardField
              ((this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.
               ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.
               ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_d0,(QArrayDataPointer<QWizardField> *)this,i,1);
    QWizardField::QWizardField(local_d0.displaceFrom,&tmp);
    local_d0.displaceFrom = local_d0.displaceFrom + 1;
    Inserter::~Inserter(&local_d0);
  }
  QWizardField::~QWizardField(&tmp);
LAB_004c8cf9:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }